

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtWrenchesAndJointTorquesEstimator.cpp
# Opt level: O2

bool __thiscall
iDynTree::ExtWrenchesAndJointTorquesEstimator::updateKinematicsFromFloatingBase
          (ExtWrenchesAndJointTorquesEstimator *this,VectorDynSize *jointPos,VectorDynSize *jointVel
          ,VectorDynSize *jointAcc,FrameIndex *floatingFrame,
          Vector3 *properClassicalLinearAcceleration,Vector3 *angularVel,Vector3 *angularAcc)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  Traversal *traversal;
  char *pcVar4;
  ClassicalAcc base_classical_acc_link;
  Vector3 zero3;
  Twist base_vel_link;
  SpatialAcc base_acc_link;
  Twist base_vel_frame;
  Transform link_H_frame;
  GeomVector3 local_1d8;
  double dStack_1c0;
  double local_1b8;
  double dStack_1b0;
  SpatialAcc local_1a0;
  Vector3 local_170;
  Vector3 local_158;
  VectorFixSize<3U> local_140;
  Twist local_128 [24];
  Vector3 local_110;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double local_b0;
  double dStack_a8;
  double local_a0;
  Twist local_90 [96];
  
  if (this->m_isModelValid == false) {
    pcVar4 = "Model and sensors information not setted.";
  }
  else {
    lVar3 = *floatingFrame;
    if (((lVar3 < 0) || (lVar3 == FRAME_INVALID_INDEX)) ||
       (lVar2 = iDynTree::Model::getNrOfFrames(), lVar2 <= lVar3)) {
      pcVar4 = "Unknown frame index specified.";
    }
    else {
      lVar3 = iDynTree::VectorDynSize::size();
      lVar2 = iDynTree::VectorDynSize::size();
      if (lVar3 == lVar2) {
        lVar3 = iDynTree::VectorDynSize::size();
        lVar2 = iDynTree::VectorDynSize::size();
        if (lVar3 != lVar2) {
          iDynTree::reportError
                    ("ExtWrenchesAndJointTorquesEstimator","updateKinematicsFromFloatingBase",
                     "Wrong size of input joint velocities.");
        }
        lVar3 = iDynTree::VectorDynSize::size();
        lVar2 = iDynTree::VectorDynSize::size();
        if (lVar3 != lVar2) {
          iDynTree::reportError
                    ("ExtWrenchesAndJointTorquesEstimator","updateKinematicsFromFloatingBase",
                     "Wrong size of input joint accelerations.");
        }
        iDynTree::JointPosDoubleArray::operator=(&this->m_jointPos,jointPos);
        iDynTree::JointDOFsDoubleArray::operator=(&this->m_jointVel,jointVel);
        iDynTree::JointDOFsDoubleArray::operator=(&this->m_jointAcc,jointAcc);
        iDynTree::Model::getFrameLink((long)this);
        iDynTree::Model::getFrameTransform((long)local_90);
        iDynTree::Twist::Twist((Twist *)&local_c8);
        iDynTree::Twist::Twist(local_128);
        VectorFixSize<3U>::zero(&local_140);
        iDynTree::GeomVector3::GeomVector3(&local_1d8);
        local_b8 = local_1d8.super_Vector3.m_data[2];
        local_c8 = local_1d8.super_Vector3.m_data[0];
        dStack_c0 = local_1d8.super_Vector3.m_data[1];
        iDynTree::GeomVector3::GeomVector3(&local_1d8);
        local_a0 = local_1d8.super_Vector3.m_data[2];
        local_b0 = local_1d8.super_Vector3.m_data[0];
        dStack_a8 = local_1d8.super_Vector3.m_data[1];
        iDynTree::Transform::operator*((Transform *)&local_1d8,local_90);
        iDynTree::Twist::operator=(local_128,(Twist *)&local_1d8);
        local_1b8 = 0.0;
        dStack_1b0 = 0.0;
        local_1d8.super_Vector3.m_data[2] = 0.0;
        dStack_1c0 = 0.0;
        local_1d8.super_Vector3.m_data[0] = 0.0;
        local_1d8.super_Vector3.m_data[1] = 0.0;
        local_d8 = 0;
        uStack_d0 = 0;
        local_e8 = 0;
        uStack_e0 = 0;
        local_f8 = 0;
        uStack_f0 = 0;
        iDynTree::GeomVector3::GeomVector3(&local_1d8);
        iDynTree::GeomVector3::GeomVector3((GeomVector3 *)&local_1a0);
        dStack_1b0 = local_1a0.super_SpatialMotionVector.
                     super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
                     m_data[2];
        dStack_1c0 = local_1a0.super_SpatialMotionVector.
                     super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
                     m_data[0];
        local_1b8 = local_1a0.super_SpatialMotionVector.
                    super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
                    m_data[1];
        iDynTree::Transform::operator*((Transform *)&local_1a0,(SpatialAcc *)local_90);
        iDynTree::SpatialAcc::operator=((SpatialAcc *)&local_f8,&local_1a0);
        iDynTree::ClassicalAcc::fromSpatial(&local_1a0,(Twist *)&local_f8);
        traversal = (Traversal *)
                    iDynTree::LinkTraversalsCache::getTraversalWithLinkAsBase
                              ((Model *)&this->m_kinematicTraversals,(long)this);
        iDynTree::ClassicalAcc::getLinearVec3();
        iDynTree::ClassicalAcc::getAngularVec3();
        bVar1 = dynamicsEstimationForwardVelAccKinematics
                          (&this->m_model,traversal,&local_158,&local_110,&local_170,
                           &this->m_jointPos,&this->m_jointVel,&this->m_jointAcc,&this->m_linkVels,
                           &this->m_linkProperAccs);
        this->m_isKinematicsUpdated = bVar1;
        return bVar1;
      }
      pcVar4 = "Wrong size of input joint positions.";
    }
  }
  iDynTree::reportError
            ("ExtWrenchesAndJointTorquesEstimator","updateKinematicsFromFloatingBase",pcVar4);
  return false;
}

Assistant:

bool ExtWrenchesAndJointTorquesEstimator::updateKinematicsFromFloatingBase(const VectorDynSize& jointPos,
                                                                           const VectorDynSize& jointVel,
                                                                           const VectorDynSize& jointAcc,
                                                                           const FrameIndex& floatingFrame,
                                                                           const Vector3& properClassicalLinearAcceleration,
                                                                           const Vector3& angularVel,
                                                                           const Vector3& angularAcc)
{
    if( !m_isModelValid )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","updateKinematicsFromFloatingBase","Model and sensors information not setted.");
        return false;
    }

    if( floatingFrame == FRAME_INVALID_INDEX ||
        floatingFrame < 0 || floatingFrame >= static_cast<FrameIndex>(m_model.getNrOfFrames()) )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","updateKinematicsFromFloatingBase","Unknown frame index specified.");
        return false;
    }

    if (m_jointPos.size() != jointPos.size())
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","updateKinematicsFromFloatingBase","Wrong size of input joint positions.");
        return false;
    }

    if (m_jointVel.size() != jointVel.size())
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","updateKinematicsFromFloatingBase","Wrong size of input joint velocities.");
    }

    if (m_jointAcc.size() != jointAcc.size())
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","updateKinematicsFromFloatingBase","Wrong size of input joint accelerations.");
    }

    m_jointPos = jointPos;
    m_jointVel = jointVel;
    m_jointAcc = jointAcc;

    // Get link of the specified frame
    LinkIndex floatingLinkIndex = m_model.getFrameLink(floatingFrame);

    // To initialize the kinematic propagation, we should first convert the kinematics
    // information from the frame in which they are specified to the main frame of the link
    Transform link_H_frame = m_model.getFrameTransform(floatingFrame);

    // Convert the twist from the additional  frame to the link frame
    Twist      base_vel_frame, base_vel_link;
    Vector3 zero3;
    zero3.zero();
    base_vel_frame.setLinearVec3(zero3);
    base_vel_frame.setAngularVec3(angularVel);
    base_vel_link = link_H_frame*base_vel_frame;

    // Convert the acceleration from the additional  frame to the link frame
    SpatialAcc base_acc_frame, base_acc_link;
    ClassicalAcc  base_classical_acc_link;
    base_acc_frame.setLinearVec3(properClassicalLinearAcceleration);
    base_acc_frame.setAngularVec3(angularAcc);
    base_acc_link = link_H_frame*base_acc_frame;
    base_classical_acc_link.fromSpatial(base_acc_link,base_vel_link);


    // Propagate the kinematics information
    bool ok = dynamicsEstimationForwardVelAccKinematics(m_model,m_kinematicTraversals.getTraversalWithLinkAsBase(m_model,floatingLinkIndex),
                                                        base_classical_acc_link.getLinearVec3(),
                                                        base_vel_link.getAngularVec3(),
                                                        base_classical_acc_link.getAngularVec3(),
                                                        m_jointPos,m_jointVel,m_jointAcc,
                                                        m_linkVels,m_linkProperAccs);


    m_isKinematicsUpdated = ok;
    return ok;
}